

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

int Lf_ManComputeCrossCut(Gia_Man_t *p)

{
  uint *puVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0xe6,"int Lf_ManComputeCrossCut(Gia_Man_t *)");
  }
  for (iVar5 = 0; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
    pGVar2 = Gia_ManObj(p,iVar5);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    pGVar2->Value = 0;
  }
  for (iVar5 = 0; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
    pGVar2 = Gia_ManObj(p,iVar5);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar3 = *(ulong *)pGVar2;
    uVar4 = uVar3 & 0x1fffffff;
    if (uVar4 != 0x1fffffff && -1 < (int)uVar3) {
      if ((~*(uint *)(pGVar2 + -uVar4) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar2 + -uVar4)) {
        pGVar2[-uVar4].Value = pGVar2[-uVar4].Value + 1;
      }
      uVar3 = (ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff);
      if ((~*(uint *)(pGVar2 + -uVar3) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar2 + -uVar3)) {
        pGVar2[-uVar3].Value = pGVar2[-uVar3].Value + 1;
      }
    }
  }
  uVar6 = 0;
  uVar7 = 0;
  for (iVar5 = 0; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
    pGVar2 = Gia_ManObj(p,iVar5);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar3 = *(ulong *)pGVar2;
    uVar4 = uVar3 & 0x1fffffff;
    if (uVar4 != 0x1fffffff && -1 < (int)uVar3) {
      uVar7 = (uVar7 + 1) - (uint)(pGVar2->Value == 0);
      if ((int)uVar6 <= (int)uVar7) {
        uVar6 = uVar7;
      }
      if ((~*(uint *)(pGVar2 + -uVar4) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar2 + -uVar4)) {
        puVar1 = &pGVar2[-uVar4].Value;
        *puVar1 = *puVar1 - 1;
        uVar7 = uVar7 - (*puVar1 == 0);
      }
      uVar3 = (ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff);
      if ((~*(uint *)(pGVar2 + -uVar3) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar2 + -uVar3)) {
        puVar1 = &pGVar2[-uVar3].Value;
        *puVar1 = *puVar1 - 1;
        uVar7 = uVar7 - (*puVar1 == 0);
      }
    }
  }
  if (uVar7 != 0) {
    __assert_fail("nCutCur == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0xfb,"int Lf_ManComputeCrossCut(Gia_Man_t *)");
  }
  iVar5 = 0;
  while (iVar5 < p->nObjs) {
    pGVar2 = Gia_ManObj(p,iVar5);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    iVar5 = iVar5 + 1;
    if (pGVar2->Value != 0) {
      __assert_fail("pObj->Value == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                    ,0xff,"int Lf_ManComputeCrossCut(Gia_Man_t *)");
    }
  }
  printf("CutMax = %d\n",(ulong)uVar6);
  return uVar6;
}

Assistant:

int Lf_ManComputeCrossCut( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nCutMax = 0, nCutCur = 0;
    assert( p->pMuxes == NULL );
    Gia_ManForEachObj( p, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
            Gia_ObjFanin0(pObj)->Value++;
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
            Gia_ObjFanin1(pObj)->Value++;
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( pObj->Value )
            nCutCur++;
        if ( nCutMax < nCutCur )
            nCutMax = nCutCur;
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) && --Gia_ObjFanin0(pObj)->Value == 0 )
            nCutCur--;
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) && --Gia_ObjFanin1(pObj)->Value == 0 )
            nCutCur--;
    }
    assert( nCutCur == 0 );
    if ( nCutCur )
        printf( "Cutset is not 0\n" );
    Gia_ManForEachObj( p, pObj, i )
        assert( pObj->Value == 0 );
    printf( "CutMax = %d\n", nCutMax );
    return nCutMax;
}